

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<void_*,_bool>,_phmap::priv::HashEq<void_*,_void>::Hash,_phmap::priv::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_bool>_>_>
::resize(raw_hash_set<phmap::priv::FlatHashMapPolicy<void_*,_bool>,_phmap::priv::HashEq<void_*,_void>::Hash,_phmap::priv::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_bool>_>_>
         *this,size_t new_capacity)

{
  size_t hashval;
  slot_type *psVar1;
  ctrl_t *p;
  size_t capacity;
  undefined1 auVar2 [16];
  bool bVar3;
  undefined7 uVar4;
  slot_type *psVar5;
  size_t sVar6;
  FindInfo FVar7;
  Layout LVar8;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    p = this->ctrl_;
    psVar5 = this->slots_;
    capacity = this->capacity_;
    initialize_slots(this,new_capacity);
    this->capacity_ = new_capacity;
    if (capacity != 0) {
      sVar6 = 0;
      do {
        if (-1 < p[sVar6]) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (psVar5->value).first;
          hashval = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,8) +
                    SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,0);
          FVar7 = find_first_non_full(this,hashval);
          set_ctrl(this,FVar7.offset,(byte)hashval & 0x7f);
          bVar3 = *(bool *)((long)psVar5 + 8);
          uVar4 = *(undefined7 *)((long)psVar5 + 9);
          psVar1 = this->slots_ + FVar7.offset;
          (psVar1->value).first = (psVar5->value).first;
          *(bool *)((long)psVar1 + 8) = bVar3;
          *(undefined7 *)((long)psVar1 + 9) = uVar4;
        }
        sVar6 = sVar6 + 1;
        psVar5 = psVar5 + 1;
      } while (capacity != sVar6);
      LVar8 = MakeLayout(capacity);
      Deallocate<8ul,std::allocator<std::pair<void*const,bool>>>
                ((allocator<std::pair<void_*const,_bool>_> *)&this->settings_,p,
                 LVar8.
                 super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<void_*,_bool>_>
                 .size_[1] * 0x10 +
                 (LVar8.
                  super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<void_*,_bool>_>
                  .size_[0] + 7 & 0xfffffffffffffff8));
      return;
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x807,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<void *, bool>, phmap::priv::HashEq<void *>::Hash, phmap::priv::HashEq<void *>::Eq, std::allocator<std::pair<void *const, bool>>>::resize(size_t) [Policy = phmap::priv::FlatHashMapPolicy<void *, bool>, Hash = phmap::priv::HashEq<void *>::Hash, Eq = phmap::priv::HashEq<void *>::Eq, Alloc = std::allocator<std::pair<void *const, bool>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }